

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcItem *pSrc,Bitmask notReady,WhereLevel *pLevel)

{
  long lVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  byte bVar4;
  u8 uVar5;
  short sVar6;
  ushort uVar7;
  Vdbe *p;
  Table *pTVar8;
  WhereLoop *p_00;
  SrcList *pSVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int p3;
  int iVar15;
  Expr *pEVar16;
  Index *pIdx;
  CollSeq *pCVar17;
  uint uVar18;
  WhereTerm *pWVar19;
  char *pcVar20;
  Op *pOVar21;
  int regOut;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  WhereTerm *pWVar26;
  uint uVar27;
  uint uVar28;
  uint uVar30;
  ulong uVar29;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar35;
  ulong uVar34;
  uint uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint uVar41;
  uint uVar43;
  uint uVar44;
  undefined1 auVar42 [16];
  uint uVar45;
  undefined1 auVar46 [16];
  ulong uVar47;
  ulong uVar48;
  Expr *local_a0;
  long local_98;
  char *zNotUsed;
  
  p = pParse->pVdbe;
  iVar12 = sqlite3VdbeAddOp3(p,0xf,0,0,0);
  pTVar8 = pSrc->pTab;
  pWVar26 = pWC->a;
  pWVar19 = pWVar26 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar28 = 0;
    uVar22 = 0xffffffffffffffff;
    local_a0 = (Expr *)0x0;
  }
  else {
    uVar28 = 0;
    uVar22 = 0;
    bVar10 = false;
    local_a0 = (Expr *)0x0;
    do {
      if ((pWVar26->wtFlags & 2) == 0) {
        pEVar16 = pWVar26->pExpr;
        iVar13 = sqlite3ExprIsTableConstraint(pEVar16,pSrc);
        if (iVar13 != 0) {
          if (pEVar16 == (Expr *)0x0) {
            pEVar16 = (Expr *)0x0;
          }
          else {
            pEVar16 = exprDup(pParse->db,pEVar16,0,(u8 **)0x0);
          }
          local_a0 = sqlite3ExprAnd(pParse,local_a0,pEVar16);
        }
      }
      iVar13 = termCanDriveIndex(pWVar26,pSrc,notReady);
      if (iVar13 != 0) {
        iVar13 = (pWVar26->u).x.leftColumn;
        uVar25 = 1L << ((byte)iVar13 & 0x3f);
        if (0x3f < iVar13) {
          uVar25 = 0x8000000000000000;
        }
        if (!bVar10) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar8->zName);
        }
        bVar10 = true;
        if ((uVar25 & uVar22) == 0) {
          iVar13 = whereLoopResize(pParse->db,p_00,uVar28 + 1);
          if (iVar13 != 0) goto LAB_0019e4d6;
          p_00->aLTerm[(int)uVar28] = pWVar26;
          uVar22 = uVar22 | uVar25;
          uVar28 = uVar28 + 1;
        }
      }
      pWVar26 = pWVar26 + 1;
    } while (pWVar26 < pWVar19);
    uVar22 = ~uVar22 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)uVar28;
  (p_00->u).btree.nEq = (u16)uVar28;
  p_00->wsFlags = 0x4241;
  uVar22 = uVar22 & pSrc->colUsed;
  sVar6 = pTVar8->nCol;
  uVar23 = (uint)sVar6;
  uVar18 = 0x3f;
  if (sVar6 < 0x3f) {
    uVar18 = uVar23;
  }
  if (0 < (int)uVar23) {
    uVar25 = (ulong)(uVar18 + 3 & 0x7c);
    lVar1 = (ulong)uVar18 - 1;
    auVar37._8_4_ = (int)lVar1;
    auVar37._0_8_ = lVar1;
    auVar37._12_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar40._8_4_ = (int)uVar22;
    auVar40._0_8_ = uVar22;
    auVar40._12_4_ = (int)(uVar22 >> 0x20);
    auVar42 = _DAT_001e3dc0;
    auVar46 = _DAT_001e3dd0;
    uVar31 = 0;
    uVar33 = 0;
    uVar36 = 0;
    do {
      uVar35 = uVar36;
      uVar32 = uVar33;
      uVar30 = uVar31;
      uVar27 = uVar28;
      auVar38 = auVar46;
      auVar39 = auVar42;
      uVar47 = 1L << auVar39._0_8_ & uVar22;
      uVar48 = 1L << auVar39._8_8_ & auVar40._8_8_;
      uVar29 = 1L << auVar38._0_8_ & uVar22;
      uVar34 = 1L << auVar38._8_8_ & auVar40._8_8_;
      uVar28 = (uVar27 - ((int)(uVar29 >> 0x20) == 0 && (int)uVar29 == 0)) + 1;
      uVar31 = (uVar30 - ((int)uVar34 == 0 && (int)(uVar34 >> 0x20) == 0)) + 1;
      uVar33 = (uVar32 - ((int)(uVar47 >> 0x20) == 0 && (int)uVar47 == 0)) + 1;
      uVar36 = (uVar35 - ((int)uVar48 == 0 && (int)(uVar48 >> 0x20) == 0)) + 1;
      auVar46._0_8_ = auVar38._0_8_ + 4;
      auVar46._8_8_ = auVar38._8_8_ + 4;
      auVar42._0_8_ = auVar39._0_8_ + 4;
      auVar42._8_8_ = auVar39._8_8_ + 4;
      uVar25 = uVar25 - 4;
    } while (uVar25 != 0);
    auVar37 = auVar37 ^ _DAT_001e3de0;
    auVar38 = auVar38 ^ _DAT_001e3de0;
    iVar13 = auVar37._4_4_;
    iVar14 = auVar37._12_4_;
    auVar39 = auVar39 ^ _DAT_001e3de0;
    uVar41 = -(uint)(iVar13 < auVar38._4_4_ ||
                    auVar38._4_4_ == iVar13 && auVar37._0_4_ < auVar38._0_4_);
    uVar43 = -(uint)(iVar14 < auVar38._12_4_ ||
                    auVar38._12_4_ == iVar14 && auVar37._8_4_ < auVar38._8_4_);
    uVar44 = -(uint)(iVar13 < auVar39._4_4_ ||
                    auVar39._4_4_ == iVar13 && auVar37._0_4_ < auVar39._0_4_);
    uVar45 = -(uint)(iVar14 < auVar39._12_4_ ||
                    auVar39._12_4_ == iVar14 && auVar37._8_4_ < auVar39._8_4_);
    uVar28 = (~uVar45 & uVar36 | uVar35 & uVar45) + (~uVar43 & uVar31 | uVar30 & uVar43) +
             (~uVar44 & uVar33 | uVar32 & uVar44) + (~uVar41 & uVar28 | uVar27 & uVar41);
  }
  iVar13 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar13 = uVar23 - 0x3e;
  }
  uVar25 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar13 + uVar28),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar8;
    pWVar26 = pWC->a;
    if (pWVar26 < pWVar19) {
      uVar25 = 0;
      uVar29 = 0;
      do {
        iVar14 = termCanDriveIndex(pWVar26,pSrc,notReady);
        if (iVar14 != 0) {
          iVar14 = (pWVar26->u).x.leftColumn;
          uVar34 = 1L << ((byte)iVar14 & 0x3f);
          if (0x3f < iVar14) {
            uVar34 = 0x8000000000000000;
          }
          if ((uVar34 & uVar29) == 0) {
            pEVar16 = pWVar26->pExpr;
            iVar24 = (int)uVar25;
            pIdx->aiColumn[iVar24] = (i16)iVar14;
            uVar23 = pEVar16->flags & 0x400;
            pCVar17 = sqlite3BinaryCompareCollSeq
                                (pParse,*(Expr **)((long)&pEVar16->pLeft + (ulong)(uVar23 >> 7)),
                                 (&pEVar16->pLeft)[uVar23 == 0]);
            pcVar20 = "BINARY";
            if (pCVar17 != (CollSeq *)0x0) {
              pcVar20 = pCVar17->zName;
            }
            uVar29 = uVar29 | uVar34;
            pIdx->azColl[iVar24] = pcVar20;
            uVar25 = (ulong)(iVar24 + 1);
          }
        }
        pWVar26 = pWVar26 + 1;
      } while (pWVar26 < pWVar19);
    }
    if (0 < sVar6) {
      uVar29 = 0;
      do {
        if ((uVar22 >> (uVar29 & 0x3f) & 1) != 0) {
          iVar14 = (int)uVar25;
          pIdx->aiColumn[iVar14] = (i16)uVar29;
          pIdx->azColl[iVar14] = "BINARY";
          uVar25 = (ulong)(iVar14 + 1);
        }
        uVar29 = uVar29 + 1;
      } while (uVar18 != uVar29);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar8->nCol)) {
      uVar25 = (ulong)(int)uVar25;
      iVar14 = 0x3f;
      do {
        pIdx->aiColumn[uVar25] = (i16)iVar14;
        pIdx->azColl[uVar25] = "BINARY";
        uVar25 = uVar25 + 1;
        iVar14 = iVar14 + 1;
      } while (iVar14 < pTVar8->nCol);
    }
    iVar24 = (int)uVar25;
    pIdx->aiColumn[iVar24] = -1;
    pIdx->azColl[iVar24] = "BINARY";
    iVar14 = pParse->nTab;
    pParse->nTab = iVar14 + 1;
    pLevel->iIdxCur = iVar14;
    sqlite3VdbeAddOp3(p,0x74,iVar14,iVar13 + uVar28,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    if ((pParse->db->dbOptFlags & 0x80000) == 0) {
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
      pLevel->regFilter = iVar13;
      sqlite3VdbeAddOp3(p,0x4d,10000,iVar13,0);
    }
    pSVar9 = pWC->pWInfo->pTabList;
    bVar4 = pLevel->iFrom;
    if ((pSVar9->a[bVar4].fg.field_0x1 & 0x20) == 0) {
      local_98 = 0;
      iVar13 = sqlite3VdbeAddOp3(p,0x24,pLevel->iTabCur,0,0);
    }
    else {
      iVar13 = pSVar9->a[bVar4].regReturn;
      iVar14 = sqlite3VdbeAddOp3(p,0x47,0,0,0);
      sqlite3VdbeAddOp3(p,0xb,iVar13,0,pSVar9->a[bVar4].addrFillSub);
      iVar13 = sqlite3VdbeAddOp3(p,0xc,iVar13,0,0);
      local_98 = (long)iVar14;
    }
    if (local_a0 == (Expr *)0x0) {
      iVar14 = 0;
    }
    else {
      iVar14 = pParse->nLabel + -1;
      pParse->nLabel = iVar14;
      sqlite3ExprIfFalse(pParse,local_a0,iVar14,0x10);
      pbVar2 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar2 = *pbVar2 | 2;
    }
    if (pParse->nTempReg == '\0') {
      regOut = pParse->nMem + 1;
      pParse->nMem = regOut;
    }
    else {
      bVar11 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar11;
      regOut = pParse->aTempReg[bVar11];
    }
    p3 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,regOut,0,(int *)0x0,(Index *)0x0,0);
    if (pLevel->regFilter != 0) {
      uVar7 = (p_00->u).btree.nEq;
      iVar15 = sqlite3VdbeAddOp3(p,0xb4,pLevel->regFilter,0,p3);
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp;
        pOVar21[iVar15].p4type = -3;
        *(uint *)&pOVar21[iVar15].p4 = (uint)uVar7;
      }
    }
    sqlite3VdbeAddOp3(p,0x8a,pLevel->iIdxCur,regOut,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_a0 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar14);
    }
    if ((pSVar9->a[bVar4].fg.field_0x1 & 0x20) == 0) {
      sqlite3VdbeAddOp3(p,0x27,pLevel->iTabCur,iVar13 + 1,0);
      iVar14 = p->nOp;
      if (0 < (long)iVar14) {
        p->aOp[(long)iVar14 + -1].p5 = 3;
      }
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + local_98;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = p3 + iVar24;
      translateColumnToCopy
                (pParse,iVar13,pLevel->iTabCur,pSVar9->a[bVar4].regResult,pLevel->iIdxCur);
      sqlite3VdbeAddOp3(p,9,0,iVar13,0);
      puVar3 = &pSVar9->a[bVar4].fg.field_0x1;
      *puVar3 = *puVar3 & 0xdf;
      iVar14 = p->nOp;
    }
    uVar5 = p->db->mallocFailed;
    if (uVar5 == '\0') {
      pOVar21 = p->aOp + iVar13;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = iVar14;
    if (regOut != 0) {
      bVar4 = pParse->nTempReg;
      if ((ulong)bVar4 < 8) {
        pParse->nTempReg = bVar4 + 1;
        pParse->aTempReg[bVar4] = regOut;
        iVar14 = p->nOp;
      }
    }
    if (uVar5 == '\0') {
      pOVar21 = p->aOp + iVar12;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = iVar14;
  }
LAB_0019e4d6:
  if (local_a0 == (Expr *)0x0) {
    return;
  }
  sqlite3ExprDeleteNN(pParse->db,local_a0);
  return;
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  const WhereClause *pWC,     /* The WHERE clause */
  const SrcItem *pSrc,        /* The FROM clause term to get the next index */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcItem *pTabItem;          /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsTableConstraint(pExpr, pSrc)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}